

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::PipeWithSmallBuffer::PipeWithSmallBuffer(PipeWithSmallBuffer *this)

{
  int iVar1;
  void *pvVar2;
  Fault local_68;
  Fault f_2;
  SyscallResult local_50;
  undefined4 local_4c;
  SyscallResult _kjSyscallResult_2;
  uint small;
  Fault f_1;
  SyscallResult local_38 [2];
  SyscallResult _kjSyscallResult_1;
  Fault local_28;
  Fault f;
  SyscallResult local_14;
  PipeWithSmallBuffer *pPStack_10;
  SyscallResult _kjSyscallResult;
  PipeWithSmallBuffer *this_local;
  
  f.exception = (Exception *)this;
  pPStack_10 = this;
  local_14 = kj::_::Debug::
             syscall<capnp::_::(anonymous_namespace)::PipeWithSmallBuffer::PipeWithSmallBuffer()::_lambda()_1_>
                       ((anon_class_8_1_8991fb9c *)&f,false);
  pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_14);
  if (pvVar2 == (void *)0x0) {
    iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_14);
    kj::_::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-async-test.c++"
               ,0x79,iVar1,"socketpair(AF_UNIX, SOCK_STREAM, 0, fds)","");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  f_1.exception = (Exception *)this;
  local_38[0] = kj::_::Debug::
                syscall<capnp::_::(anonymous_namespace)::PipeWithSmallBuffer::PipeWithSmallBuffer()::_lambda()_2_>
                          ((anon_class_8_1_8991fb9c *)&f_1,false);
  pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_38);
  if (pvVar2 != (void *)0x0) {
    local_4c = 0x7f;
    setsockopt(this->fds[0],1,8,&local_4c,4);
    f_2.exception = (Exception *)this;
    local_50 = kj::_::Debug::
               syscall<capnp::_::(anonymous_namespace)::PipeWithSmallBuffer::PipeWithSmallBuffer()::_lambda()_3_>
                         ((anon_class_16_2_f880d5f4 *)&f_2,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_50);
    if (pvVar2 != (void *)0x0) {
      return;
    }
    iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_50);
    kj::_::Debug::Fault::Fault
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-async-test.c++"
               ,0x8f,iVar1,
               "setsockopt(fds[1], SOL_SOCKET, SO_SNDBUF, (const char*)&small, sizeof(small))","");
    kj::_::Debug::Fault::fatal(&local_68);
  }
  iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(local_38);
  kj::_::Debug::Fault::Fault
            ((Fault *)&_kjSyscallResult_2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-async-test.c++"
             ,0x7b,iVar1,"shutdown(fds[0], SHUT_WR)","");
  kj::_::Debug::Fault::fatal((Fault *)&_kjSyscallResult_2);
}

Assistant:

PipeWithSmallBuffer() {
    // Use a socketpair rather than a pipe so that we can set the buffer size extremely small.
    KJ_SOCKCALL(socketpair(AF_UNIX, SOCK_STREAM, 0, fds));

    KJ_SOCKCALL(shutdown(fds[0], SHUT_WR));
    // Note:  OSX reports ENOTCONN if we also try to shutdown(fds[1], SHUT_RD).

    // Request that the buffer size be as small as possible, to force the event loop to kick in.
    // FUN STUFF:
    // - On Linux, the kernel rounds up to the smallest size it permits, so we can ask for a size of
    //   zero.
    // - On OSX, the kernel reports EINVAL on zero, but will dutifully use a 1-byte buffer if we
    //   set the size to 1.  This tends to cause stack overflows due to ridiculously long promise
    //   chains.
    // - Cygwin will apparently actually use a buffer size of 0 and therefore block forever waiting
    //   for buffer space.
    // - GNU HURD throws ENOPROTOOPT for SO_RCVBUF. Apparently, technically, a Unix domain socket
    //   has only one buffer, and it's controlled via SO_SNDBUF on the other end. OK, we'll ignore
    //   errors on SO_RCVBUF, then.
    //
    // Anyway, we now use 127 to avoid these issues (but also to screw around with non-word-boundary
    // writes).
    uint small = 127;
    setsockopt(fds[0], SOL_SOCKET, SO_RCVBUF, (const char*)&small, sizeof(small));
    KJ_SOCKCALL(setsockopt(fds[1], SOL_SOCKET, SO_SNDBUF, (const char*)&small, sizeof(small)));
  }